

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlattenPass.cpp
# Opt level: O1

PreservedAnalyses * __thiscall
Flatten::run(PreservedAnalyses *__return_storage_ptr__,Flatten *this,Module *M,
            ModuleAnalysisManager *AM)

{
  Module *pMVar1;
  void **ppvVar2;
  void **ppvVar3;
  bool bVar4;
  bool bVar5;
  undefined1 *puVar6;
  CallGraphNode *pCVar7;
  int iVar8;
  undefined1 *puVar9;
  Module *F;
  SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
  *this_00;
  Module *pMVar10;
  bool bVar11;
  SmallSetVector<llvm::Function_*,_4U> ModifiedFunctions;
  CallGraph CG;
  value_type local_e8;
  Module *local_e0;
  SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
  *local_d8;
  SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
  local_d0;
  CallGraph local_78 [16];
  undefined1 local_68 [8];
  undefined1 *local_60;
  
  local_d0.set_.
  super_DenseSetImpl<llvm::Function_*,_llvm::SmallDenseMap<llvm::Function_*,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseSetPair<llvm::Function_*>_>,_llvm::DenseMapInfo<llvm::Function_*,_void>_>
  .TheMap._0_1_ =
       local_d0.set_.
       super_DenseSetImpl<llvm::Function_*,_llvm::SmallDenseMap<llvm::Function_*,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseSetPair<llvm::Function_*>_>,_llvm::DenseMapInfo<llvm::Function_*,_void>_>
       .TheMap._0_1_ | 1;
  local_d8 = (SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
              *)this;
  llvm::
  DenseMapBase<llvm::SmallDenseMap<llvm::Function_*,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseSetPair<llvm::Function_*>_>,_llvm::Function_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseSetPair<llvm::Function_*>_>
  ::initEmpty((DenseMapBase<llvm::SmallDenseMap<llvm::Function_*,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseSetPair<llvm::Function_*>_>,_llvm::Function_*,_llvm::detail::DenseSetEmpty,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseSetPair<llvm::Function_*>_>
               *)&local_d0);
  local_d0.vector_.super_SmallVectorImpl<llvm::Function_*>.
  super_SmallVectorTemplateBase<llvm::Function_*,_true>.
  super_SmallVectorTemplateCommon<llvm::Function_*,_void>.super_SmallVectorBase<unsigned_int>.BeginX
       = &local_d0.vector_.super_SmallVectorStorage<llvm::Function_*,_4U>;
  local_d0.vector_.super_SmallVectorImpl<llvm::Function_*>.
  super_SmallVectorTemplateBase<llvm::Function_*,_true>.
  super_SmallVectorTemplateCommon<llvm::Function_*,_void>.super_SmallVectorBase<unsigned_int>.Size =
       0;
  local_d0.vector_.super_SmallVectorImpl<llvm::Function_*>.
  super_SmallVectorTemplateBase<llvm::Function_*,_true>.
  super_SmallVectorTemplateCommon<llvm::Function_*,_void>.super_SmallVectorBase<unsigned_int>.
  Capacity = 4;
  pMVar1 = M + 0x18;
  bVar4 = false;
  local_e0 = M;
  do {
    this_00 = (SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
               *)local_78;
    llvm::CallGraph::CallGraph((CallGraph *)this_00,M);
    pMVar10 = *(Module **)(M + 0x20);
    if (pMVar10 == pMVar1) {
      bVar11 = false;
    }
    else {
      bVar11 = false;
      do {
        F = pMVar10 + -0x38;
        puVar6 = local_68;
        puVar9 = local_60;
        if (pMVar10 == (Module *)0x0) {
          F = (Module *)0x0;
        }
        for (; puVar9 != (undefined1 *)0x0;
            puVar9 = *(undefined1 **)
                      (puVar9 + (ulong)(*(Function **)(puVar9 + 0x20) < F) * 8 + 0x10)) {
          if (*(Function **)(puVar9 + 0x20) >= F) {
            puVar6 = puVar9;
          }
        }
        puVar9 = local_68;
        if ((puVar6 != local_68) && (puVar9 = puVar6, F < *(Function **)(puVar6 + 0x20))) {
          puVar9 = local_68;
        }
        if (puVar9 == local_68) {
          __assert_fail("I != FunctionMap.end() && \"Function not in callgraph!\"",
                        "/usr/lib/llvm-14/include/llvm/Analysis/CallGraph.h",0x7a,
                        "CallGraphNode *llvm::CallGraph::operator[](const Function *)");
        }
        pCVar7 = getSingleCaller((Flatten *)this_00,local_78,*(CallGraphNode **)(puVar9 + 0x28));
        if (pCVar7 == (CallGraphNode *)0x0) {
          iVar8 = 5;
        }
        else {
          this_00 = local_d8;
          bVar5 = inlineFunction((Flatten *)local_d8,(Function *)F,*(Function **)(pCVar7 + 8));
          iVar8 = 0;
          if (bVar5) {
            local_e8 = *(value_type *)(pCVar7 + 8);
            this_00 = &local_d0;
            llvm::
            SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
            ::insert(this_00,&local_e8);
            local_e8 = (value_type)F;
            llvm::
            SetVector<llvm::Function_*,_llvm::SmallVector<llvm::Function_*,_4U>,_llvm::SmallDenseSet<llvm::Function_*,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>_>_>
            ::remove(this_00,(char *)&local_e8);
            bVar11 = true;
            iVar8 = 4;
            bVar4 = true;
          }
        }
        M = local_e0;
      } while (((iVar8 == 5) || (iVar8 == 0)) &&
              (pMVar10 = *(Module **)(pMVar10 + 8), pMVar10 != pMVar1));
    }
    llvm::CallGraph::~CallGraph(local_78);
    if (!bVar11) {
      if (bVar4) {
        (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
        super_SmallPtrSetImplBase.SmallArray = (void **)0x0;
        (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
        super_SmallPtrSetImplBase.CurArray = (void **)0x0;
        (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
        super_SmallPtrSetImplBase.CurArraySize = 0;
        (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
        super_SmallPtrSetImplBase.NumNonEmpty = 0;
        *(undefined8 *)
         &(__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
          super_SmallPtrSetImplBase.NumTombstones = 0;
        (__return_storage_ptr__->NotPreservedAnalysisIDs).super_SmallPtrSetImpl<llvm::AnalysisKey_*>
        .super_SmallPtrSetImplBase.SmallArray = (void **)0x0;
        (__return_storage_ptr__->NotPreservedAnalysisIDs).super_SmallPtrSetImpl<llvm::AnalysisKey_*>
        .super_SmallPtrSetImplBase.CurArray = (void **)0x0;
        (__return_storage_ptr__->NotPreservedAnalysisIDs).super_SmallPtrSetImpl<llvm::AnalysisKey_*>
        .super_SmallPtrSetImplBase.CurArraySize = 0;
        (__return_storage_ptr__->NotPreservedAnalysisIDs).super_SmallPtrSetImpl<llvm::AnalysisKey_*>
        .super_SmallPtrSetImplBase.NumNonEmpty = 0;
        *(undefined8 *)
         &(__return_storage_ptr__->NotPreservedAnalysisIDs).
          super_SmallPtrSetImpl<llvm::AnalysisKey_*>.super_SmallPtrSetImplBase.NumTombstones = 0;
        (__return_storage_ptr__->NotPreservedAnalysisIDs).SmallStorage[0] = (void *)0x0;
        (__return_storage_ptr__->NotPreservedAnalysisIDs).SmallStorage[1] = (void *)0x0;
        (__return_storage_ptr__->PreservedIDs).SmallStorage[0] = (void *)0x0;
        (__return_storage_ptr__->PreservedIDs).SmallStorage[1] = (void *)0x0;
        ppvVar2 = (__return_storage_ptr__->NotPreservedAnalysisIDs).SmallStorage;
        ppvVar3 = (__return_storage_ptr__->PreservedIDs).SmallStorage;
        (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
        super_SmallPtrSetImplBase.SmallArray = ppvVar3;
        (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
        super_SmallPtrSetImplBase.CurArray = ppvVar3;
        (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
        super_SmallPtrSetImplBase.CurArraySize = 2;
        (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
        super_SmallPtrSetImplBase.NumNonEmpty = 0;
        (__return_storage_ptr__->PreservedIDs).super_SmallPtrSetImpl<void_*>.
        super_SmallPtrSetImplBase.NumTombstones = 0;
        (__return_storage_ptr__->NotPreservedAnalysisIDs).super_SmallPtrSetImpl<llvm::AnalysisKey_*>
        .super_SmallPtrSetImplBase.SmallArray = ppvVar2;
        (__return_storage_ptr__->NotPreservedAnalysisIDs).super_SmallPtrSetImpl<llvm::AnalysisKey_*>
        .super_SmallPtrSetImplBase.CurArray = ppvVar2;
        (__return_storage_ptr__->NotPreservedAnalysisIDs).super_SmallPtrSetImpl<llvm::AnalysisKey_*>
        .super_SmallPtrSetImplBase.CurArraySize = 2;
        (__return_storage_ptr__->NotPreservedAnalysisIDs).super_SmallPtrSetImpl<llvm::AnalysisKey_*>
        .super_SmallPtrSetImplBase.NumNonEmpty = 0;
        (__return_storage_ptr__->NotPreservedAnalysisIDs).super_SmallPtrSetImpl<llvm::AnalysisKey_*>
        .super_SmallPtrSetImplBase.NumTombstones = 0;
      }
      else {
        llvm::PreservedAnalyses::all();
      }
      if ((SmallVectorStorage<llvm::Function_*,_4U> *)
          local_d0.vector_.super_SmallVectorImpl<llvm::Function_*>.
          super_SmallVectorTemplateBase<llvm::Function_*,_true>.
          super_SmallVectorTemplateCommon<llvm::Function_*,_void>.
          super_SmallVectorBase<unsigned_int>.BeginX !=
          &local_d0.vector_.super_SmallVectorStorage<llvm::Function_*,_4U>) {
        free(local_d0.vector_.super_SmallVectorImpl<llvm::Function_*>.
             super_SmallVectorTemplateBase<llvm::Function_*,_true>.
             super_SmallVectorTemplateCommon<llvm::Function_*,_void>.
             super_SmallVectorBase<unsigned_int>.BeginX);
      }
      llvm::
      SmallDenseMap<llvm::Function_*,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseSetPair<llvm::Function_*>_>
      ::deallocateBuckets((SmallDenseMap<llvm::Function_*,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<llvm::Function_*,_void>,_llvm::detail::DenseSetPair<llvm::Function_*>_>
                           *)&local_d0);
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

llvm::PreservedAnalyses Flatten::run(Module &M, ModuleAnalysisManager &AM) {
  bool ModifiedAny = false;
  bool ModifiedOne = false;
  SmallSetVector<Function *, 4> ModifiedFunctions;

  // We keep running, inlining functions into other functions, until there's
  // no work left to do.
  do {
    ModifiedOne = false;

    // Build the call graph of the entire module.
    CallGraph CG(M);

    for (Function &F : M.functions()) {
      CallGraphNode *CGN = CG[&F];
      CallGraphNode *Caller = getSingleCaller(CG, CGN);

      if (Caller == nullptr) {
        continue; // We need a function with a single caller function
      }

      if (inlineFunction(&F, Caller->getFunction())) {
        // Keep track of functions that need reg2mem
        ModifiedFunctions.insert(Caller->getFunction());
        ModifiedFunctions.remove(&F);

        // Mark the module as modified and start over
        ModifiedOne = true;
        ModifiedAny = true;
        break;
      }
    }

  } while (ModifiedOne);

  if (ModifiedAny) {
    return llvm::PreservedAnalyses::none();
  }
  return llvm::PreservedAnalyses::all();
}